

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O2

void __thiscall duckdb::QueryProfiler::EndPhase(QueryProfiler *this)

{
  Profiler *this_00;
  mapped_type *pmVar1;
  pointer pMVar2;
  MetricsType *phase;
  pointer pMVar3;
  double dVar4;
  
  ::std::mutex::lock(&this->lock);
  if (((this->is_explain_analyze != false) || ((this->context->config).enable_profiler == true)) &&
     (this->running == true)) {
    this_00 = &this->phase_profiler;
    BaseProfiler<std::chrono::_V2::steady_clock>::End(this_00);
    pMVar2 = (this->phase_stack).
             super_vector<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>.
             super__Vector_base<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pMVar3 = (this->phase_stack).
                  super_vector<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>.
                  super__Vector_base<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>.
                  _M_impl.super__Vector_impl_data._M_start; pMVar3 != pMVar2; pMVar3 = pMVar3 + 1) {
      dVar4 = BaseProfiler<std::chrono::_V2::steady_clock>::Elapsed(this_00);
      pmVar1 = ::std::__detail::
               _Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_double>,_std::allocator<std::pair<const_duckdb::MetricsType,_double>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_double>,_std::allocator<std::pair<const_duckdb::MetricsType,_double>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&this->phase_timings,pMVar3);
      *pmVar1 = dVar4 + *pmVar1;
    }
    pMVar3 = (this->phase_stack).
             super_vector<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>.
             super__Vector_base<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>._M_impl.
             super__Vector_impl_data._M_start;
    pMVar2 = (this->phase_stack).
             super_vector<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>.
             super__Vector_base<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
    (this->phase_stack).super_vector<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>.
    super__Vector_base<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>._M_impl.
    super__Vector_impl_data._M_finish = pMVar2;
    if (pMVar3 != pMVar2) {
      BaseProfiler<std::chrono::_V2::steady_clock>::Start(this_00);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
  return;
}

Assistant:

void QueryProfiler::EndPhase() {
	lock_guard<std::mutex> guard(lock);
	if (!IsEnabled() || !running) {
		return;
	}
	D_ASSERT(!phase_stack.empty());

	// end the timer
	phase_profiler.End();
	// add the timing to all currently active phases
	for (auto &phase : phase_stack) {
		phase_timings[phase] += phase_profiler.Elapsed();
	}
	// now remove the last added phase
	phase_stack.pop_back();

	if (!phase_stack.empty()) {
		phase_profiler.Start();
	}
}